

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

void __thiscall re2::Compiler::Compiler(Compiler *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  Prog *this_00;
  
  Regexp::Walker<re2::Frag>::Walker(&this->super_Walker<re2::Frag>);
  (this->super_Walker<re2::Frag>)._vptr_Walker = (_func_int **)&PTR__Compiler_00149348;
  p_Var1 = &(this->rune_cache_)._M_t._M_impl.super__Rb_tree_header;
  (this->rune_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rune_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rune_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rune_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rune_cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rune_range_).begin = 0;
  (this->rune_range_).end = 0;
  this_00 = (Prog *)operator_new(0x1b8);
  Prog::Prog(this_00);
  this->prog_ = this_00;
  this->failed_ = false;
  this->encoding_ = kEncodingUTF8;
  this->reversed_ = false;
  this->inst_ = (Inst *)0x0;
  this->inst_len_ = 0;
  this->inst_cap_ = 0;
  this->max_inst_ = 1;
  this->max_mem_ = 0;
  iVar2 = AllocInst(this,1);
  Prog::Inst::InitFail(this->inst_ + iVar2);
  this->max_inst_ = 0;
  return;
}

Assistant:

Compiler::Compiler() {
  prog_ = new Prog();
  failed_ = false;
  encoding_ = kEncodingUTF8;
  reversed_ = false;
  inst_ = NULL;
  inst_len_ = 0;
  inst_cap_ = 0;
  max_inst_ = 1;  // make AllocInst for fail instruction okay
  max_mem_ = 0;
  int fail = AllocInst(1);
  inst_[fail].InitFail();
  max_inst_ = 0;  // Caller must change
}